

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *effect,MOJOSHADER_effectTechnique *technique)

{
  long lVar1;
  MOJOSHADER_effectTechnique *pMVar2;
  
  lVar1 = (long)effect->technique_count;
  if (0 < lVar1) {
    pMVar2 = effect->techniques + -1;
    do {
      pMVar2 = pMVar2 + 1;
      if (pMVar2 == technique) {
        effect->current_technique = technique;
        return;
      }
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  __assert_fail("0 && \"Technique is not part of this effect!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                ,0x6a9,
                "void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *, const MOJOSHADER_effectTechnique *)"
               );
}

Assistant:

void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *effect,
                                   const MOJOSHADER_effectTechnique *technique)
{
    int i;
    for (i = 0; i < effect->technique_count; i++)
    {
        if (technique == &effect->techniques[i])
        {
            effect->current_technique = technique;
            return;
        } // if
    } // for
    assert(0 && "Technique is not part of this effect!");
}